

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

char * store_type_to_str(store_type stype)

{
  if (stype < 5) {
    return (&PTR_anon_var_dwarf_37_0010cb70)[stype];
  }
  return (char *)0x0;
}

Assistant:

char *store_type_to_str(enum store_type stype){
    switch (stype) {
        case UNBOUNDED_MAPSTORE:
            return "UNBOUNDED MAPSTORE";
        case COLLAPSINGHIGH_MAPSTORE:
            return "HIGH COLLAPSING MAPSTORE";
        case COLLAPSINGLOW_MAPSTORE:
            return "LOW COLLAPSING MAPSTORE";
        case COLLAPSINGALL_MAPSTORE:
            return "UNIFORM COLLAPSING MAPSTORE";
        case UNIFORM_WITH_INITIAL_ALPHA:
            return "UNIFORM COLLAPSING WITH INITIAL ALPHA";
        default:
            return NULL;
    }
}